

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O1

StringTree * capnp::compiler::expressionStringTree(Reader exp)

{
  byte bVar1;
  Reader exp_00;
  Reader exp_01;
  Reader exp_02;
  Reader params;
  Reader params_00;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Branch *pBVar5;
  CappedArray<char,_26UL> *params_1;
  StringTree *pSVar6;
  ushort uVar7;
  ArrayPtr<const_char> *pAVar8;
  unsigned_long uVar9;
  CappedArray<char,_32UL> *params_01;
  CappedArray<char,_26UL> *params_02;
  size_t sVar10;
  undefined8 unaff_RBX;
  size_t sVar11;
  StringTree *in_RDI;
  char (*params_2) [3];
  char *pcVar12;
  FixedArray<char,_1UL> *in_R9;
  undefined8 unaff_R12;
  ulong capacity;
  undefined8 unaff_R13;
  size_t sVar13;
  ElementCount index;
  undefined8 unaff_R14;
  undefined4 uVar14;
  undefined4 uVar15;
  Reader RVar16;
  StringPtr SVar17;
  Reader RVar18;
  undefined8 unaff_retaddr;
  size_t in_stack_00000008;
  ArrayDisposer *in_stack_00000010;
  ushort *in_stack_00000018;
  size_t in_stack_00000020;
  uint in_stack_00000028;
  ushort in_stack_0000002c;
  undefined2 in_stack_0000002e;
  Vector<char> escaped;
  ArrayBuilder<kj::StringTree> parts;
  Reader list;
  Reader element;
  StringTree local_1d8;
  StringTree *local_1a0;
  undefined1 local_198 [40];
  StringTree local_170;
  ArrayDisposer *local_138;
  size_t local_130;
  StringTree local_128;
  ListReader local_f0;
  StructReader local_c0;
  StructReader local_90;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  
  params_1 = (CappedArray<char,_26UL> *)(ulong)in_stack_00000028;
  if (in_stack_00000028 < 0x10) {
    uVar7 = 0;
  }
  else {
    uVar7 = *in_stack_00000018;
  }
  if (0xd < uVar7) {
    kj::_::unreachable();
  }
  pAVar8 = (ArrayPtr<const_char> *)
           ((long)&switchD_003c1a19::switchdataD_0059f434 +
           (long)(int)(&switchD_003c1a19::switchdataD_0059f434)[uVar7]);
  local_1a0 = in_RDI;
  switch(uVar7) {
  case 0:
    pSVar6 = &local_1d8;
    local_1d8.size_ = 0x5a2a1e;
    local_1d8.text.content.ptr = &DAT_0000000d;
    goto LAB_003c21a0;
  case 1:
    if (in_stack_00000028 < 0x80) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(unsigned_long *)(in_stack_00000018 + 4);
    }
    kj::_::Stringifier::operator*
              ((CappedArray<char,_26UL> *)&local_1d8,(Stringifier *)&kj::_::STR,uVar9);
    kj::StringTree::concat<kj::CappedArray<char,26ul>>(in_RDI,&local_1d8,params_02);
    break;
  case 2:
    if (in_stack_00000028 < 0x80) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(unsigned_long *)(in_stack_00000018 + 4);
    }
    local_170.size_ = CONCAT71(local_170.size_._1_7_,0x2d);
    kj::_::Stringifier::operator*
              ((CappedArray<char,_26UL> *)&local_1d8,(Stringifier *)&kj::_::STR,uVar9);
    kj::StringTree::concat<kj::FixedArray<char,1ul>,kj::CappedArray<char,26ul>>
              (in_RDI,(StringTree *)(local_198 + 0x28),(FixedArray<char,_1UL> *)&local_1d8,params_1)
    ;
    break;
  case 3:
    uVar14 = 0;
    uVar15 = 0;
    if (0x7f < in_stack_00000028) {
      uVar14 = (undefined4)*(undefined8 *)(in_stack_00000018 + 4);
      uVar15 = (undefined4)((ulong)*(undefined8 *)(in_stack_00000018 + 4) >> 0x20);
    }
    kj::_::Stringifier::operator*
              ((CappedArray<char,_32UL> *)&local_1d8,(Stringifier *)&kj::_::STR,
               (double)CONCAT44(uVar15,uVar14));
    kj::StringTree::concat<kj::CappedArray<char,32ul>>(in_RDI,&local_1d8,params_01);
    break;
  case 4:
    if (in_stack_0000002c == 0) {
      escaped.builder.ptr._0_4_ = 0x7fffffff;
      in_stack_00000010 = (ArrayDisposer *)0x0;
      in_stack_00000020 = 0;
      in_stack_00000008 = 0;
    }
    local_1d8.text.content.disposer =
         (ArrayDisposer *)CONCAT44(local_1d8.text.content.disposer._4_4_,escaped.builder.ptr._0_4_);
    local_1d8.size_ = in_stack_00000008;
    local_1d8.text.content.ptr = (char *)in_stack_00000010;
    local_1d8.text.content.size_ = in_stack_00000020;
    SVar17.content =
         (ArrayPtr<const_char>)
         capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_1d8,(void *)0x0,0);
    stringLiteralStringTree(in_RDI,SVar17);
    break;
  case 5:
    if (in_stack_0000002c == 0) {
      in_stack_00000010 = (ArrayDisposer *)0x0;
      in_stack_00000020 = 0;
      in_stack_00000008 = 0;
      escaped.builder.ptr._0_4_ = 0x7fffffff;
    }
    local_170.size_ = in_stack_00000008;
    local_170.text.content.ptr = (char *)in_stack_00000010;
    local_170.text.content.size_ = in_stack_00000020;
    local_170.text.content.disposer._0_4_ = escaped.builder.ptr._0_4_;
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_1d8,(PointerReader *)(local_198 + 0x28),(word *)0x0);
    local_170.text.content.size_ = (size_t)(ArrayDisposer *)0x0;
    local_170.size_ = (size_t)(ArrayPtr<const_char> *)0x0;
    local_170.text.content.ptr = (char *)(ArrayDisposer *)0x0;
    local_170.text.content.disposer._0_4_ = 0x7fffffff;
    if (local_1d8.branches.ptr._4_2_ != 0) {
      local_170.text.content.size_ = (size_t)local_1d8.text.content.disposer;
      local_170.size_ = local_1d8.size_;
      local_170.text.content.ptr = local_1d8.text.content.ptr;
      local_170.text.content.disposer._0_4_ = (uint)local_1d8.branches.size_;
    }
    RVar16 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)(local_198 + 0x28),(void *)0x0,0);
    local_170.size_ = RVar16.super_StringPtr.content.ptr;
    pAVar8 = (ArrayPtr<const_char> *)(RVar16.super_StringPtr.content.size_ - 1);
    pSVar6 = (StringTree *)(local_198 + 0x28);
    local_170.text.content.ptr = (char *)pAVar8;
LAB_003c21a0:
    kj::StringTree::concat<kj::ArrayPtr<char_const>>(in_RDI,pSVar6,pAVar8);
    break;
  case 6:
    local_1d8.text.content.ptr = (char *)in_stack_00000010;
    local_1d8.text.content.size_ = in_stack_00000020;
    local_1d8.size_ = in_stack_00000008;
    if (in_stack_0000002c == 0) {
      escaped.builder.ptr._0_4_ = 0x7fffffff;
      local_1d8.text.content.ptr = (char *)(ArrayDisposer *)0x0;
      local_1d8.text.content.size_ = 0;
      local_1d8.size_ = 0;
    }
    local_1d8.text.content.disposer =
         (ArrayDisposer *)CONCAT44(local_1d8.text.content.disposer._4_4_,escaped.builder.ptr._0_4_);
    index = 0;
    capnp::_::PointerReader::getList
              ((ListReader *)(local_198 + 0x28),(PointerReader *)&local_1d8,INLINE_COMPOSITE,
               (word *)0x0);
    capacity = (ulong)(uint)local_170.text.content.disposer;
    params_2 = (char (*) [3])0x0;
    local_198._0_8_ =
         kj::_::HeapArrayDisposer::allocateImpl
                   (0x38,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_198._16_8_ = local_198._0_8_ + capacity * 7 * 8;
    local_198._24_8_ = &kj::_::HeapArrayDisposer::instance;
    local_198._8_8_ = local_198._0_8_;
    if ((uint)local_170.text.content.disposer != 0) {
      pcVar12 = local_1d8.text.content.ptr;
      sVar10 = local_1d8.text.content.size_;
      pBVar5 = local_1d8.branches.ptr;
      sVar13 = local_1d8.branches.size_;
      do {
        local_1d8.branches.size_ = sVar13;
        local_1d8.branches.ptr = pBVar5;
        local_1d8.text.content.size_ = sVar10;
        local_1d8.text.content.ptr = pcVar12;
        capnp::_::ListReader::getStructElement
                  ((StructReader *)&local_128,(ListReader *)(local_198 + 0x28),index);
        exp_01._reader.capTable = (CapTableReader *)in_stack_00000008;
        exp_01._reader.segment = (SegmentReader *)unaff_retaddr;
        exp_01._reader.data = in_stack_00000010;
        exp_01._reader.pointers = (WirePointer *)in_stack_00000018;
        exp_01._reader._32_8_ = in_stack_00000020;
        exp_01._reader.nestingLimit = in_stack_00000028;
        exp_01._reader._44_2_ = in_stack_0000002c;
        exp_01._reader._46_2_ = in_stack_0000002e;
        expressionStringTree(exp_01);
        *(size_t *)local_198._8_8_ = local_1d8.size_;
        *(char **)(local_198._8_8_ + 8) = local_1d8.text.content.ptr;
        *(size_t *)(local_198._8_8_ + 0x10) = local_1d8.text.content.size_;
        *(ArrayDisposer **)(local_198._8_8_ + 0x18) = local_1d8.text.content.disposer;
        local_1d8.text.content.ptr = (char *)0x0;
        pcVar12 = local_1d8.text.content.ptr;
        local_1d8.text.content.size_ = 0;
        sVar10 = local_1d8.text.content.size_;
        *(Branch **)(local_198._8_8_ + 0x20) = local_1d8.branches.ptr;
        *(size_t *)(local_198._8_8_ + 0x28) = local_1d8.branches.size_;
        *(ArrayDisposer **)(local_198._8_8_ + 0x30) = local_1d8.branches.disposer;
        local_1d8.branches.ptr = (Branch *)0x0;
        pBVar5 = local_1d8.branches.ptr;
        local_1d8.branches.size_ = 0;
        sVar13 = local_1d8.branches.size_;
        local_198._8_8_ = local_198._8_8_ + 0x38;
        local_1d8.branches.size_ = 0;
        local_1d8.branches.ptr = (Branch *)0x0;
        local_1d8.text.content.size_ = 0;
        local_1d8.text.content.ptr = (char *)0x0;
        index = index + 1;
      } while ((uint)local_170.text.content.disposer != index);
    }
    local_128.text.content.ptr =
         (char *)(((long)(local_198._8_8_ - local_198._0_8_) >> 3) * 0x6db6db6db6db6db7);
    local_128.size_ = local_198._0_8_;
    local_128.text.content.size_ = local_198._24_8_;
    local_198._0_8_ = 0;
    local_198._8_8_ = (char *)0x0;
    local_198._16_8_ = 0;
    SVar17.content.size_ = 3;
    SVar17.content.ptr = ", ";
    kj::StringTree::StringTree(&local_1d8,(Array<kj::StringTree> *)&local_128,SVar17);
    kj::strTree<char_const(&)[3],kj::StringTree,char_const(&)[3]>
              (local_1a0,(kj *)"[ ",(char (*) [3])&local_1d8,(StringTree *)0x5527cc,params_2);
    sVar10 = local_1d8.branches.size_;
    pBVar5 = local_1d8.branches.ptr;
    if (local_1d8.branches.ptr != (Branch *)0x0) {
      local_1d8.branches.ptr = (Branch *)0x0;
      local_1d8.branches.size_ = 0;
      (**(local_1d8.branches.disposer)->_vptr_ArrayDisposer)
                (local_1d8.branches.disposer,pBVar5,0x40,sVar10,sVar10,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar10 = local_1d8.text.content.size_;
    pcVar12 = local_1d8.text.content.ptr;
    if ((ArrayDisposer *)local_1d8.text.content.ptr != (ArrayDisposer *)0x0) {
      local_1d8.text.content.ptr = (char *)0x0;
      local_1d8.text.content.size_ = 0;
      (**(local_1d8.text.content.disposer)->_vptr_ArrayDisposer)
                (local_1d8.text.content.disposer,pcVar12,1,sVar10,sVar10,0);
    }
    pcVar12 = local_128.text.content.ptr;
    sVar10 = local_128.size_;
    if ((size_t *)local_128.size_ != (size_t *)0x0) {
      local_128.size_ = 0;
      local_128.text.content.ptr = (char *)0x0;
      (***(_func_int ***)local_128.text.content.size_)
                (local_128.text.content.size_,sVar10,0x38,pcVar12,pcVar12,
                 kj::ArrayDisposer::Dispose_<kj::StringTree>::destruct);
    }
    uVar4 = local_198._16_8_;
    uVar3 = local_198._8_8_;
    uVar2 = local_198._0_8_;
    in_RDI = local_1a0;
    if (local_198._0_8_ != 0) {
      local_198._0_8_ = 0;
      local_198._8_8_ = (char *)0x0;
      local_198._16_8_ = 0;
      (***(_func_int ***)local_198._24_8_)
                (local_198._24_8_,uVar2,0x38,((long)(uVar3 - uVar2) >> 3) * 0x6db6db6db6db6db7,
                 ((long)(uVar4 - uVar2) >> 3) * 0x6db6db6db6db6db7,
                 kj::ArrayDisposer::Dispose_<kj::StringTree>::destruct);
      in_RDI = local_1a0;
    }
    break;
  case 7:
    if (in_stack_0000002c == 0) {
      escaped.builder.ptr._0_4_ = 0x7fffffff;
      in_stack_00000010 = (ArrayDisposer *)0x0;
      in_stack_00000020 = 0;
      in_stack_00000008 = 0;
    }
    local_1d8.text.content.disposer =
         (ArrayDisposer *)CONCAT44(local_1d8.text.content.disposer._4_4_,escaped.builder.ptr._0_4_);
    local_1d8.size_ = in_stack_00000008;
    local_1d8.text.content.ptr = (char *)in_stack_00000010;
    local_1d8.text.content.size_ = in_stack_00000020;
    capnp::_::PointerReader::getList
              ((ListReader *)&stack0xffffffffffffffa0,(PointerReader *)&local_1d8,INLINE_COMPOSITE,
               (word *)0x0);
    params_00.reader.capTable = (CapTableReader *)in_stack_ffffffffffffffc8;
    params_00.reader.segment = (SegmentReader *)in_stack_ffffffffffffffc0;
    params_00.reader.ptr = (byte *)unaff_RBX;
    params_00.reader.elementCount = (int)unaff_R12;
    params_00.reader.step = (int)((ulong)unaff_R12 >> 0x20);
    params_00.reader.structDataSize = (int)unaff_R13;
    params_00.reader.structPointerCount = (short)((ulong)unaff_R13 >> 0x20);
    params_00.reader.elementSize = (char)((ulong)unaff_R13 >> 0x30);
    params_00.reader._39_1_ = (char)((ulong)unaff_R13 >> 0x38);
    params_00.reader._40_8_ = unaff_R14;
    tupleLiteral(params_00);
    break;
  case 8:
    if (in_stack_0000002c == 0) {
      escaped.builder.ptr._0_4_ = 0x7fffffff;
      in_stack_00000010 = (ArrayDisposer *)0x0;
      in_stack_00000020 = 0;
      in_stack_00000008 = 0;
    }
    local_1d8.text.content.disposer =
         (ArrayDisposer *)CONCAT44(local_1d8.text.content.disposer._4_4_,escaped.builder.ptr._0_4_);
    local_1d8.size_ = in_stack_00000008;
    local_1d8.text.content.ptr = (char *)in_stack_00000010;
    local_1d8.text.content.size_ = in_stack_00000020;
    RVar18 = capnp::_::PointerReader::getBlob<capnp::Data>
                       ((PointerReader *)&local_1d8,(void *)0x0,0);
    sVar10 = RVar18.super_ArrayPtr<const_unsigned_char>.size_;
    pcVar12 = (char *)0x0;
    local_1d8.size_ =
         (size_t)kj::_::HeapArrayDisposer::allocateImpl
                           (1,0,sVar10 * 3,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_1d8.text.content.size_ = local_1d8.size_ + sVar10 * 3;
    local_1d8.text.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_1d8.text.content.ptr = (char *)local_1d8.size_;
    if (sVar10 != 0) {
      sVar13 = 0;
      do {
        bVar1 = RVar18.super_ArrayPtr<const_unsigned_char>.ptr[sVar13];
        if (local_1d8.text.content.ptr == (char *)local_1d8.text.content.size_) {
          sVar11 = (local_1d8.text.content.size_ - local_1d8.size_) * 2;
          if (local_1d8.text.content.size_ == local_1d8.size_) {
            sVar11 = 4;
          }
          kj::Vector<char>::setCapacity((Vector<char> *)&local_1d8,sVar11);
        }
        *local_1d8.text.content.ptr = "0123456789abcdef"[bVar1 & 0xf];
        local_1d8.text.content.ptr = local_1d8.text.content.ptr + 1;
        if (local_1d8.text.content.ptr == (char *)local_1d8.text.content.size_) {
          sVar11 = (local_1d8.text.content.size_ - local_1d8.size_) * 2;
          if (local_1d8.text.content.size_ == local_1d8.size_) {
            sVar11 = 4;
          }
          kj::Vector<char>::setCapacity((Vector<char> *)&local_1d8,sVar11);
        }
        *local_1d8.text.content.ptr = "0123456789abcdef"[bVar1 >> 4];
        local_1d8.text.content.ptr = local_1d8.text.content.ptr + 1;
        if (local_1d8.text.content.ptr == (char *)local_1d8.text.content.size_) {
          sVar11 = (local_1d8.text.content.size_ - local_1d8.size_) * 2;
          if (local_1d8.text.content.size_ == local_1d8.size_) {
            sVar11 = 4;
          }
          kj::Vector<char>::setCapacity((Vector<char> *)&local_1d8,sVar11);
        }
        *local_1d8.text.content.ptr = ' ';
        local_1d8.text.content.ptr = local_1d8.text.content.ptr + 1;
        sVar13 = sVar13 + 1;
      } while (sVar10 != sVar13);
    }
    local_1d8.text.content.ptr = local_1d8.text.content.ptr + -1;
    local_170.size_ = CONCAT71(local_170.size_._1_7_,0x22);
    kj::strTree<char_const(&)[4],kj::Vector<char>&,char>
              (local_1a0,(kj *)"0x\"",(char (*) [4])&local_1d8,(Vector<char> *)(local_198 + 0x28),
               pcVar12);
    sVar13 = local_1d8.text.content.size_;
    pcVar12 = local_1d8.text.content.ptr;
    sVar10 = local_1d8.size_;
    in_RDI = local_1a0;
    if ((char *)local_1d8.size_ != (char *)0x0) {
      local_1d8.size_ = 0;
      local_1d8.text.content.ptr = (char *)0x0;
      local_1d8.text.content.size_ = 0;
      (**(local_1d8.text.content.disposer)->_vptr_ArrayDisposer)
                (local_1d8.text.content.disposer,sVar10,1,(long)pcVar12 - sVar10,sVar13 - sVar10,0);
    }
    break;
  case 9:
    local_130 = in_stack_00000008;
    local_138 = in_stack_00000010;
    local_170.text.content.ptr = (char *)in_stack_00000010;
    local_170.text.content.size_ = in_stack_00000020;
    local_170.size_ = in_stack_00000008;
    local_170.text.content.disposer._0_4_ = escaped.builder.ptr._0_4_;
    if (in_stack_0000002c == 0) {
      local_170.text.content.ptr = (char *)(ArrayDisposer *)0x0;
      local_170.text.content.size_ = 0;
      local_170.size_ = 0;
      local_170.text.content.disposer._0_4_ = 0x7fffffff;
    }
    capnp::_::PointerReader::getStruct(&local_90,(PointerReader *)(local_198 + 0x28),(word *)0x0);
    exp_00._reader.capTable = (CapTableReader *)in_stack_00000008;
    exp_00._reader.segment = (SegmentReader *)unaff_retaddr;
    exp_00._reader.data = in_stack_00000010;
    exp_00._reader.pointers = (WirePointer *)in_stack_00000018;
    exp_00._reader._32_8_ = in_stack_00000020;
    exp_00._reader.nestingLimit = in_stack_00000028;
    exp_00._reader._44_2_ = in_stack_0000002c;
    exp_00._reader._46_2_ = in_stack_0000002e;
    expressionStringTree(exp_00);
    local_128.text.content.size_ = 0;
    local_128.size_ = 0;
    local_128.text.content.ptr = (char *)(ArrayDisposer *)0x0;
    local_128.text.content.disposer._0_4_ = 0x7fffffff;
    if (1 < in_stack_0000002c) {
      local_128.text.content.size_ = in_stack_00000020 + 8;
      local_128.size_ = local_130;
      local_128.text.content.ptr = (char *)local_138;
      local_128.text.content.disposer._0_4_ = escaped.builder.ptr._0_4_;
    }
    capnp::_::PointerReader::getList
              (&local_f0,(PointerReader *)&local_128,INLINE_COMPOSITE,(word *)0x0);
    params.reader.capTable = (CapTableReader *)in_stack_ffffffffffffffc8;
    params.reader.segment = (SegmentReader *)in_stack_ffffffffffffffc0;
    params.reader.ptr = (byte *)unaff_RBX;
    params.reader.elementCount = (int)unaff_R12;
    params.reader.step = (int)((ulong)unaff_R12 >> 0x20);
    params.reader.structDataSize = (int)unaff_R13;
    params.reader.structPointerCount = (short)((ulong)unaff_R13 >> 0x20);
    params.reader.elementSize = (char)((ulong)unaff_R13 >> 0x30);
    params.reader._39_1_ = (char)((ulong)unaff_R13 >> 0x38);
    params.reader._40_8_ = unaff_R14;
    tupleLiteral(params);
    local_128.size_ = CONCAT71(local_128.size_._1_7_,0x28);
    local_198[0] = 0x29;
    kj::StringTree::
    concat<kj::StringTree,kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
              (local_1a0,&local_1d8,&local_128,(FixedArray<char,_1UL> *)(local_198 + 0x28),
               (StringTree *)local_198,in_R9);
    sVar10 = local_170.branches.size_;
    pBVar5 = local_170.branches.ptr;
    if (local_170.branches.ptr != (Branch *)0x0) {
      local_170.branches.ptr = (Branch *)0x0;
      local_170.branches.size_ = 0;
      (*(code *)*(local_170.branches.disposer)->_vptr_ArrayDisposer)
                (local_170.branches.disposer,pBVar5,0x40,sVar10,sVar10,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct,local_f0.segment,
                 local_f0.capTable,local_f0.ptr,local_f0._24_8_,local_f0._32_8_,local_f0._40_8_);
    }
    sVar10 = local_170.text.content.size_;
    pcVar12 = local_170.text.content.ptr;
    if ((ArrayDisposer *)local_170.text.content.ptr != (ArrayDisposer *)0x0) {
      local_170.text.content.ptr = (char *)0x0;
      local_170.text.content.size_ = 0;
      (*(code *)**(undefined8 **)
                  CONCAT44(local_170.text.content.disposer._4_4_,
                           (uint)local_170.text.content.disposer))
                ((undefined8 *)
                 CONCAT44(local_170.text.content.disposer._4_4_,
                          (uint)local_170.text.content.disposer),pcVar12,1,sVar10,sVar10,0);
    }
    sVar10 = local_1d8.branches.size_;
    pBVar5 = local_1d8.branches.ptr;
    if (local_1d8.branches.ptr != (Branch *)0x0) {
      local_1d8.branches.ptr = (Branch *)0x0;
      local_1d8.branches.size_ = 0;
      (**(local_1d8.branches.disposer)->_vptr_ArrayDisposer)
                (local_1d8.branches.disposer,pBVar5,0x40,sVar10,sVar10,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar10 = local_1d8.text.content.size_;
    pcVar12 = local_1d8.text.content.ptr;
    in_RDI = local_1a0;
    if ((ArrayDisposer *)local_1d8.text.content.ptr != (ArrayDisposer *)0x0) {
      local_1d8.text.content.ptr = (char *)0x0;
      local_1d8.text.content.size_ = 0;
      (**(local_1d8.text.content.disposer)->_vptr_ArrayDisposer)
                (local_1d8.text.content.disposer,pcVar12,1,sVar10,sVar10,0);
    }
    break;
  case 10:
    local_130 = in_stack_00000008;
    local_138 = in_stack_00000010;
    local_170.text.content.ptr = (char *)in_stack_00000010;
    local_170.text.content.size_ = in_stack_00000020;
    local_170.size_ = in_stack_00000008;
    local_170.text.content.disposer._0_4_ = escaped.builder.ptr._0_4_;
    if (in_stack_0000002c == 0) {
      local_170.text.content.ptr = (char *)(ArrayDisposer *)0x0;
      local_170.text.content.size_ = 0;
      local_170.size_ = 0;
      local_170.text.content.disposer._0_4_ = 0x7fffffff;
    }
    capnp::_::PointerReader::getStruct(&local_c0,(PointerReader *)(local_198 + 0x28),(word *)0x0);
    exp_02._reader.capTable = (CapTableReader *)in_stack_00000008;
    exp_02._reader.segment = (SegmentReader *)unaff_retaddr;
    exp_02._reader.data = in_stack_00000010;
    exp_02._reader.pointers = (WirePointer *)in_stack_00000018;
    exp_02._reader._32_8_ = in_stack_00000020;
    exp_02._reader.nestingLimit = in_stack_00000028;
    exp_02._reader._44_2_ = in_stack_0000002c;
    exp_02._reader._46_2_ = in_stack_0000002e;
    expressionStringTree(exp_02);
    local_128.text.content.size_ = 0;
    local_128.size_ = 0;
    local_128.text.content.ptr = (char *)(ArrayDisposer *)0x0;
    local_128.text.content.disposer._0_4_ = 0x7fffffff;
    if (1 < in_stack_0000002c) {
      local_128.text.content.size_ = in_stack_00000020 + 8;
      local_128.size_ = local_130;
      local_128.text.content.ptr = (char *)local_138;
      local_128.text.content.disposer._0_4_ = escaped.builder.ptr._0_4_;
    }
    capnp::_::PointerReader::getStruct
              ((StructReader *)(local_198 + 0x28),(PointerReader *)&local_128,(word *)0x0);
    if (local_170.branches.ptr._4_2_ == 0) {
      local_170.branches.size_._0_4_ = 0x7fffffff;
      local_128.text.content.ptr = (char *)0x0;
      local_128.text.content.size_ = 0;
      local_128.size_ = 0;
    }
    else {
      local_128.text.content.size_ =
           CONCAT44(local_170.text.content.disposer._4_4_,(uint)local_170.text.content.disposer);
      local_128.text.content.ptr = local_170.text.content.ptr;
      local_128.size_ = local_170.size_;
    }
    local_128.text.content.disposer._0_4_ = (undefined4)local_170.branches.size_;
    RVar16 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&local_128,(void *)0x0,0);
    local_128.size_ = RVar16.super_StringPtr.content.ptr;
    local_198[0] = 0x2e;
    local_128.text.content.ptr = (char *)(RVar16.super_StringPtr.content.size_ - 1);
    kj::StringTree::concat<kj::StringTree,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
              (local_1a0,&local_1d8,(StringTree *)local_198,(FixedArray<char,_1UL> *)&local_128,
               (ArrayPtr<const_char> *)local_198);
    sVar10 = local_1d8.branches.size_;
    pBVar5 = local_1d8.branches.ptr;
    if (local_1d8.branches.ptr != (Branch *)0x0) {
      local_1d8.branches.ptr = (Branch *)0x0;
      local_1d8.branches.size_ = 0;
      (**(local_1d8.branches.disposer)->_vptr_ArrayDisposer)
                (local_1d8.branches.disposer,pBVar5,0x40,sVar10,sVar10,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct,local_c0.segment,
                 local_c0.capTable,local_c0.data,local_c0.pointers,local_c0._32_8_,local_c0._40_8_);
    }
    sVar10 = local_1d8.text.content.size_;
    pcVar12 = local_1d8.text.content.ptr;
    in_RDI = local_1a0;
    if ((ArrayDisposer *)local_1d8.text.content.ptr != (ArrayDisposer *)0x0) {
      local_1d8.text.content.ptr = (char *)0x0;
      local_1d8.text.content.size_ = 0;
      (**(local_1d8.text.content.disposer)->_vptr_ArrayDisposer)
                (local_1d8.text.content.disposer,pcVar12,1,sVar10,sVar10,0);
    }
    break;
  case 0xb:
    if (in_stack_0000002c == 0) {
      in_stack_00000010 = (ArrayDisposer *)0x0;
      in_stack_00000020 = 0;
      in_stack_00000008 = 0;
      escaped.builder.ptr._0_4_ = 0x7fffffff;
    }
    local_170.size_ = in_stack_00000008;
    local_170.text.content.ptr = (char *)in_stack_00000010;
    local_170.text.content.size_ = in_stack_00000020;
    local_170.text.content.disposer._0_4_ = escaped.builder.ptr._0_4_;
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_1d8,(PointerReader *)(local_198 + 0x28),(word *)0x0);
    local_170.text.content.size_ = (size_t)(ArrayDisposer *)0x0;
    local_170.size_ = (size_t)(ArrayPtr<const_char> *)0x0;
    local_170.text.content.ptr = (char *)(ArrayDisposer *)0x0;
    local_170.text.content.disposer._0_4_ = 0x7fffffff;
    if (local_1d8.branches.ptr._4_2_ != 0) {
      local_170.text.content.size_ = (size_t)local_1d8.text.content.disposer;
      local_170.size_ = local_1d8.size_;
      local_170.text.content.ptr = local_1d8.text.content.ptr;
      local_170.text.content.disposer._0_4_ = (uint)local_1d8.branches.size_;
    }
    RVar16 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)(local_198 + 0x28),(void *)0x0,0);
    local_128.size_ = CONCAT71(local_128.size_._1_7_,0x2e);
    local_170.text.content.ptr = (char *)(RVar16.super_StringPtr.content.size_ - 1);
    pAVar8 = (ArrayPtr<const_char> *)local_170.size_;
    local_170.size_ = (size_t)RVar16.super_StringPtr.content.ptr;
    kj::StringTree::concat<kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
              (in_RDI,&local_128,(FixedArray<char,_1UL> *)(local_198 + 0x28),pAVar8);
    break;
  case 0xc:
    if (in_stack_0000002c == 0) {
      in_stack_00000010 = (ArrayDisposer *)0x0;
      in_stack_00000020 = 0;
      in_stack_00000008 = 0;
      escaped.builder.ptr._0_4_ = 0x7fffffff;
    }
    local_128.size_ = in_stack_00000008;
    local_128.text.content.ptr = (char *)in_stack_00000010;
    local_128.text.content.size_ = in_stack_00000020;
    local_128.text.content.disposer._0_4_ = escaped.builder.ptr._0_4_;
    capnp::_::PointerReader::getStruct
              ((StructReader *)(local_198 + 0x28),(PointerReader *)&local_128,(word *)0x0);
    local_128.text.content.size_ = 0;
    pSVar6 = (StringTree *)0x0;
    local_128.text.content.ptr = (char *)(ArrayPtr<const_char> *)0x0;
    local_128.text.content.disposer._0_4_ = 0x7fffffff;
    if (local_170.branches.ptr._4_2_ != 0) {
      local_128.text.content.size_ =
           CONCAT44(local_170.text.content.disposer._4_4_,(uint)local_170.text.content.disposer);
      pSVar6 = (StringTree *)local_170.size_;
      local_128.text.content.ptr = local_170.text.content.ptr;
      local_128.text.content.disposer._0_4_ = (undefined4)local_170.branches.size_;
    }
    local_128.size_ = (size_t)pSVar6;
    SVar17.content =
         (ArrayPtr<const_char>)
         capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_128,(void *)0x0,0);
    stringLiteralStringTree(&local_1d8,SVar17);
    local_128.size_ = 0x5a2a2c;
    local_128.text.content.ptr = &DAT_00000007;
    kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree>
              (in_RDI,&local_128,(ArrayPtr<const_char> *)&local_1d8,pSVar6);
    sVar10 = local_1d8.branches.size_;
    pBVar5 = local_1d8.branches.ptr;
    if (local_1d8.branches.ptr != (Branch *)0x0) {
      local_1d8.branches.ptr = (Branch *)0x0;
      local_1d8.branches.size_ = 0;
      (**(local_1d8.branches.disposer)->_vptr_ArrayDisposer)
                (local_1d8.branches.disposer,pBVar5,0x40,sVar10,sVar10,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar10 = local_1d8.text.content.size_;
    pcVar12 = local_1d8.text.content.ptr;
    if ((ArrayDisposer *)local_1d8.text.content.ptr != (ArrayDisposer *)0x0) {
      local_1d8.text.content.ptr = (char *)0x0;
      local_1d8.text.content.size_ = 0;
      (**(local_1d8.text.content.disposer)->_vptr_ArrayDisposer)
                (local_1d8.text.content.disposer,pcVar12,1,sVar10,sVar10,0);
    }
    break;
  case 0xd:
    if (in_stack_0000002c == 0) {
      in_stack_00000010 = (ArrayDisposer *)0x0;
      in_stack_00000020 = 0;
      in_stack_00000008 = 0;
      escaped.builder.ptr._0_4_ = 0x7fffffff;
    }
    local_128.size_ = in_stack_00000008;
    local_128.text.content.ptr = (char *)in_stack_00000010;
    local_128.text.content.size_ = in_stack_00000020;
    local_128.text.content.disposer._0_4_ = escaped.builder.ptr._0_4_;
    capnp::_::PointerReader::getStruct
              ((StructReader *)(local_198 + 0x28),(PointerReader *)&local_128,(word *)0x0);
    local_128.text.content.size_ = 0;
    pSVar6 = (StringTree *)0x0;
    local_128.text.content.ptr = (char *)(ArrayPtr<const_char> *)0x0;
    local_128.text.content.disposer._0_4_ = 0x7fffffff;
    if (local_170.branches.ptr._4_2_ != 0) {
      local_128.text.content.size_ =
           CONCAT44(local_170.text.content.disposer._4_4_,(uint)local_170.text.content.disposer);
      pSVar6 = (StringTree *)local_170.size_;
      local_128.text.content.ptr = local_170.text.content.ptr;
      local_128.text.content.disposer._0_4_ = (undefined4)local_170.branches.size_;
    }
    local_128.size_ = (size_t)pSVar6;
    SVar17.content =
         (ArrayPtr<const_char>)
         capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_128,(void *)0x0,0);
    stringLiteralStringTree(&local_1d8,SVar17);
    local_128.size_ = 0x5a2a34;
    local_128.text.content.ptr = (char *)0x6;
    kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree>
              (in_RDI,&local_128,(ArrayPtr<const_char> *)&local_1d8,pSVar6);
    sVar10 = local_1d8.branches.size_;
    pBVar5 = local_1d8.branches.ptr;
    if (local_1d8.branches.ptr != (Branch *)0x0) {
      local_1d8.branches.ptr = (Branch *)0x0;
      local_1d8.branches.size_ = 0;
      (**(local_1d8.branches.disposer)->_vptr_ArrayDisposer)
                (local_1d8.branches.disposer,pBVar5,0x40,sVar10,sVar10,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar10 = local_1d8.text.content.size_;
    pcVar12 = local_1d8.text.content.ptr;
    if ((ArrayDisposer *)local_1d8.text.content.ptr != (ArrayDisposer *)0x0) {
      local_1d8.text.content.ptr = (char *)0x0;
      local_1d8.text.content.size_ = 0;
      (**(local_1d8.text.content.disposer)->_vptr_ArrayDisposer)
                (local_1d8.text.content.disposer,pcVar12,1,sVar10,sVar10,0);
    }
  }
  return in_RDI;
}

Assistant:

static kj::StringTree expressionStringTree(Expression::Reader exp) {
  switch (exp.which()) {
    case Expression::UNKNOWN:
      return kj::strTree("<parse error>");
    case Expression::POSITIVE_INT:
      return kj::strTree(exp.getPositiveInt());
    case Expression::NEGATIVE_INT:
      return kj::strTree('-', exp.getNegativeInt());
    case Expression::FLOAT:
      return kj::strTree(exp.getFloat());
    case Expression::STRING:
      return stringLiteralStringTree(exp.getString());
    case Expression::BINARY:
      return binaryLiteralStringTree(exp.getBinary());
    case Expression::RELATIVE_NAME:
      return kj::strTree(exp.getRelativeName().getValue());
    case Expression::ABSOLUTE_NAME:
      return kj::strTree('.', exp.getAbsoluteName().getValue());
    case Expression::IMPORT:
      return kj::strTree("import ", stringLiteralStringTree(exp.getImport().getValue()));
    case Expression::EMBED:
      return kj::strTree("embed ", stringLiteralStringTree(exp.getEmbed().getValue()));

    case Expression::LIST: {
      auto list = exp.getList();
      auto parts = kj::heapArrayBuilder<kj::StringTree>(list.size());
      for (auto element: list) {
        parts.add(expressionStringTree(element));
      }
      return kj::strTree("[ ", kj::StringTree(parts.finish(), ", "), " ]");
    }

    case Expression::TUPLE:
      return tupleLiteral(exp.getTuple());

    case Expression::APPLICATION: {
      auto app = exp.getApplication();
      return kj::strTree(expressionStringTree(app.getFunction()),
                         '(', tupleLiteral(app.getParams()), ')');
    }

    case Expression::MEMBER: {
      auto member = exp.getMember();
      return kj::strTree(expressionStringTree(member.getParent()), '.',
                         member.getName().getValue());
    }
  }

  KJ_UNREACHABLE;
}